

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerMSL::add_msl_shader_input(CompilerMSL *this,MSLShaderInput *si)

{
  MSLShaderInputFormat MVar1;
  BuiltIn BVar2;
  uint32_t uVar3;
  mapped_type *pmVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  BuiltIn local_18;
  BuiltIn local_14;
  
  pmVar4 = ::std::
           map<unsigned_int,_spirv_cross::MSLShaderInput,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
           ::operator[](&this->inputs_by_location,&si->location);
  MVar1 = si->format;
  BVar2 = si->builtin;
  uVar3 = si->vecsize;
  pmVar4->location = si->location;
  pmVar4->format = MVar1;
  pmVar4->builtin = BVar2;
  pmVar4->vecsize = uVar3;
  local_14 = si->builtin;
  if (local_14 != BuiltInMax) {
    sVar5 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&(this->inputs_by_builtin)._M_h,&local_14);
    if (sVar5 == 0) {
      _local_18 = CONCAT44(local_14,si->builtin);
      pmVar6 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->inputs_by_builtin,&local_18);
      MVar1 = si->format;
      BVar2 = si->builtin;
      uVar3 = si->vecsize;
      pmVar6->location = si->location;
      pmVar6->format = MVar1;
      pmVar6->builtin = BVar2;
      pmVar6->vecsize = uVar3;
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_msl_shader_input(const MSLShaderInput &si)
{
	inputs_by_location[si.location] = si;
	if (si.builtin != BuiltInMax && !inputs_by_builtin.count(si.builtin))
		inputs_by_builtin[si.builtin] = si;
}